

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O2

FIRFilter * __thiscall
SignalProcessing::FIRFilter::operator-(FIRFilter *__return_storage_ptr__,FIRFilter *this)

{
  pointer pfVar1;
  vector<float,_std::allocator<float>_> negative_coefficients;
  float local_5c;
  _Vector_base<float,_std::allocator<float>_> local_58;
  _Vector_base<float,_std::allocator<float>_> local_40;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  get_coefficients((vector<float,_std::allocator<float>_> *)&local_40,this);
  for (pfVar1 = local_40._M_impl.super__Vector_impl_data._M_start;
      pfVar1 != local_40._M_impl.super__Vector_impl_data._M_finish; pfVar1 = pfVar1 + 1) {
    local_5c = 1.0 - *pfVar1;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)&local_58,&local_5c);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_40);
  FIRFilter(__return_storage_ptr__,(vector<float,_std::allocator<float>_> *)&local_58);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

FIRFilter FIRFilter::operator-() const {
	std::vector<float> negative_coefficients;

	for(const auto coefficient: get_coefficients()) {
		negative_coefficients.push_back(1.0f - coefficient);
	}

	return FIRFilter(negative_coefficients);
}